

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2,SorterRecord **ppOut)

{
  SorterRecord *pSVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_2_0134e7e8_for_u *paVar4;
  SorterRecord *pKey2;
  SorterRecord *pSVar5;
  SorterRecord *pFinal;
  anon_union_8_2_0134e7e8_for_u local_38;
  
  local_38.pNext = (SorterRecord *)0x0;
  pKey2 = p2 + 1;
  paVar4 = &local_38;
  if (p2 == (SorterRecord *)0x0) {
    pKey2 = (SorterRecord *)0x0;
    paVar4 = &local_38;
  }
  do {
    pSVar5 = p1;
    if ((p1 == (SorterRecord *)0x0) || (p2 == (SorterRecord *)0x0)) break;
    iVar3 = vdbeSorterCompare(pTask,p1 + 1,p1->nVal,pKey2,p2->nVal);
    if (iVar3 < 1) {
      paVar4->pNext = p1;
      pSVar5 = (p1->u).pNext;
      paVar4 = &p1->u;
      bVar2 = true;
      pKey2 = (SorterRecord *)0x0;
    }
    else {
      paVar4->pNext = p2;
      pSVar1 = (p2->u).pNext;
      paVar4 = &p2->u;
      if (pSVar1 == (SorterRecord *)0x0) {
        p2 = (SorterRecord *)0x0;
        bVar2 = false;
      }
      else {
        pKey2 = pSVar1 + 1;
        bVar2 = true;
        p2 = pSVar1;
      }
    }
    p1 = pSVar5;
  } while (bVar2);
  if (pSVar5 != (SorterRecord *)0x0) {
    p2 = pSVar5;
  }
  paVar4->pNext = p2;
  *ppOut = (SorterRecord *)local_38;
  return;
}

Assistant:

static void vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2,               /* Second list to merge */
  SorterRecord **ppOut            /* OUT: Head of merged list */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  void *pVal2 = p2 ? SRVAL(p2) : 0;

  while( p1 && p2 ){
    int res;
    res = vdbeSorterCompare(pTask, SRVAL(p1), p1->nVal, pVal2, p2->nVal);
    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      pVal2 = 0;
    }else{
      *pp = p2;
       pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      if( p2==0 ) break;
      pVal2 = SRVAL(p2);
    }
  }
  *pp = p1 ? p1 : p2;
  *ppOut = pFinal;
}